

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::DynamicMapField::DeleteMapValue(DynamicMapField *this,MapKey *map_key)

{
  iterator pos;
  bool bVar1;
  pointer pvVar2;
  iterator local_80;
  Node *local_68;
  Node *local_60;
  InnerMap *local_58;
  iterator local_50;
  undefined1 local_38 [8];
  iterator iter;
  MapKey *map_key_local;
  DynamicMapField *this_local;
  
  iter.it_.bucket_index_ = (size_type)map_key;
  MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
            ((iterator *)local_38,&this->map_,(key_type *)iter.it_.bucket_index_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end(&local_50,&this->map_);
  bVar1 = protobuf::operator==((iterator *)local_38,&local_50);
  if (!bVar1) {
    MapFieldBase::SetMapDirty((MapFieldBase *)this);
    pvVar2 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                       ((iterator *)local_38);
    MapValueRef::DeleteData(&pvVar2->second);
    local_68 = (Node *)local_38;
    local_60 = iter.it_.node_;
    local_58 = iter.it_.m_;
    pos.it_.m_ = (InnerMap *)iter.it_.node_;
    pos.it_.node_ = (Node *)local_38;
    pos.it_.bucket_index_ = (size_type)iter.it_.m_;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase(&local_80,&this->map_,pos);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool DynamicMapField::DeleteMapValue(const MapKey& map_key) {
  MapFieldBase::SyncMapWithRepeatedField();
  Map<MapKey, MapValueRef>::iterator iter = map_.find(map_key);
  if (iter == map_.end()) {
    return false;
  }
  // Set map dirty only if the delete is successful.
  MapFieldBase::SetMapDirty();
  iter->second.DeleteData();
  map_.erase(iter);
  return true;
}